

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecimalDatatypeValidator.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::DecimalDatatypeValidator::checkContent
          (DecimalDatatypeValidator *this,XMLCh *content,ValidationContext *context,bool asBase,
          MemoryManager *manager)

{
  uint uVar1;
  DatatypeValidator *pDVar2;
  RefVectorOf<xercesc_4_0::XMLNumber> *pRVar3;
  XMLSize_t XVar4;
  bool bVar5;
  int iVar6;
  XMLNumber *pXVar7;
  InvalidDatatypeValueException *pIVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  InvalidDatatypeFacetException *pIVar9;
  undefined4 extraout_var_01;
  XMLSize_t getAt;
  XMLSize_t XVar10;
  XMLBigDecimal compareDataValue;
  XMLCh value1 [65];
  XMLCh value2 [65];
  XMLBigDecimal local_180;
  XMLCh local_148 [72];
  XMLCh local_b8 [68];
  
  pDVar2 = (this->super_AbstractNumericValidator).super_AbstractNumericFacetValidator.
           super_DatatypeValidator.fBaseValidator;
  if (pDVar2 != (DatatypeValidator *)0x0) {
    (*(pDVar2->super_XSerializable)._vptr_XSerializable[0x11])(pDVar2,content,context,1,manager);
  }
  uVar1 = (this->super_AbstractNumericValidator).super_AbstractNumericFacetValidator.
          super_DatatypeValidator.fFacetsDefined;
  if (((uVar1 & 8) != 0) &&
     (bVar5 = RegularExpression::matches
                        ((this->super_AbstractNumericValidator).super_AbstractNumericFacetValidator.
                         super_DatatypeValidator.fRegex,content,manager), !bVar5)) {
    pIVar8 = (InvalidDatatypeValueException *)__cxa_allocate_exception(0x30);
    InvalidDatatypeValueException::InvalidDatatypeValueException
              (pIVar8,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/DecimalDatatypeValidator.cpp"
               ,0x199,VALUE_NotMatch_Pattern,content,
               (this->super_AbstractNumericValidator).super_AbstractNumericFacetValidator.
               super_DatatypeValidator.fPattern,(XMLCh *)0x0,(XMLCh *)0x0,manager);
    __cxa_throw(pIVar8,&InvalidDatatypeValueException::typeinfo,XMLException::~XMLException);
  }
  if (!asBase) {
    XMLBigDecimal::XMLBigDecimal(&local_180,content,manager);
    pRVar3 = (this->super_AbstractNumericValidator).super_AbstractNumericFacetValidator.fEnumeration
    ;
    if (pRVar3 != (RefVectorOf<xercesc_4_0::XMLNumber> *)0x0) {
      XVar4 = (pRVar3->super_BaseRefVectorOf<xercesc_4_0::XMLNumber>).fCurCount;
      if (XVar4 == 0) {
        XVar10 = 0;
      }
      else {
        getAt = 0;
        do {
          pXVar7 = BaseRefVectorOf<xercesc_4_0::XMLNumber>::elementAt
                             (&((this->super_AbstractNumericValidator).
                                super_AbstractNumericFacetValidator.fEnumeration)->
                               super_BaseRefVectorOf<xercesc_4_0::XMLNumber>,getAt);
          iVar6 = (*(this->super_AbstractNumericValidator).super_AbstractNumericFacetValidator.
                    super_DatatypeValidator.super_XSerializable._vptr_XSerializable[0x10])
                            (this,&local_180,pXVar7);
          XVar10 = getAt;
          if (iVar6 == 0) break;
          getAt = getAt + 1;
          XVar10 = XVar4;
        } while (XVar4 != getAt);
      }
      if (XVar10 == XVar4) {
        pIVar8 = (InvalidDatatypeValueException *)__cxa_allocate_exception(0x30);
        InvalidDatatypeValueException::InvalidDatatypeValueException
                  (pIVar8,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/DecimalDatatypeValidator.cpp"
                   ,0x1b0,VALUE_NotIn_Enumeration,content,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                   manager);
        __cxa_throw(pIVar8,&InvalidDatatypeValueException::typeinfo,XMLException::~XMLException);
      }
    }
    AbstractNumericValidator::boundsCheck
              (&this->super_AbstractNumericValidator,&local_180.super_XMLNumber,manager);
    if (((uVar1 >> 10 & 1) != 0) && (this->fFractionDigits < local_180.fScale)) {
      XMLString::binToText(local_180.fScale,local_148,0x40,10,manager);
      XMLString::binToText(this->fFractionDigits,local_b8,0x40,10,manager);
      pIVar9 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
      iVar6 = (**(_func_int **)
                 ((long)local_180.super_XMLNumber.super_XSerializable._vptr_XSerializable + 0x28))()
      ;
      InvalidDatatypeFacetException::InvalidDatatypeFacetException
                (pIVar9,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/DecimalDatatypeValidator.cpp"
                 ,0x1c2,VALUE_exceed_fractDigit,(XMLCh *)CONCAT44(extraout_var,iVar6),local_148,
                 local_b8,(XMLCh *)0x0,manager);
      __cxa_throw(pIVar9,&InvalidDatatypeFacetException::typeinfo,XMLException::~XMLException);
    }
    if ((uVar1 >> 9 & 1) != 0) {
      if (this->fTotalDigits < local_180.fTotalDigits) {
        XMLString::binToText(local_180.fTotalDigits,local_148,0x40,10,manager);
        XMLString::binToText(this->fTotalDigits,local_b8,0x40,10,manager);
        pIVar9 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        iVar6 = (**(_func_int **)
                   ((long)local_180.super_XMLNumber.super_XSerializable._vptr_XSerializable + 0x28))
                          ();
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (pIVar9,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/DecimalDatatypeValidator.cpp"
                   ,0x1d3,VALUE_exceed_totalDigit,(XMLCh *)CONCAT44(extraout_var_00,iVar6),local_148
                   ,local_b8,(XMLCh *)0x0,manager);
        __cxa_throw(pIVar9,&InvalidDatatypeFacetException::typeinfo,XMLException::~XMLException);
      }
      if (this->fTotalDigits < local_180.fScale) {
        XMLString::binToText(local_180.fScale,local_148,0x40,10,manager);
        XMLString::binToText(this->fTotalDigits,local_b8,0x40,10,manager);
        pIVar9 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        iVar6 = (**(_func_int **)
                   ((long)local_180.super_XMLNumber.super_XSerializable._vptr_XSerializable + 0x28))
                          ();
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (pIVar9,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/DecimalDatatypeValidator.cpp"
                   ,0x1e7,VALUE_exceed_totalDigit,(XMLCh *)CONCAT44(extraout_var_01,iVar6),local_148
                   ,local_b8,(XMLCh *)0x0,manager);
        __cxa_throw(pIVar9,&InvalidDatatypeFacetException::typeinfo,XMLException::~XMLException);
      }
    }
    XMLBigDecimal::~XMLBigDecimal(&local_180);
  }
  return;
}

Assistant:

void DecimalDatatypeValidator::checkContent(const XMLCh*             const content
                                           ,      ValidationContext* const context
                                           ,      bool                     asBase
                                           ,      MemoryManager*     const manager)
{
    //validate against base validator if any
    DecimalDatatypeValidator *pBase = (DecimalDatatypeValidator*) this->getBaseValidator();
    if (pBase)
        pBase->checkContent(content, context, true, manager);

    int thisFacetsDefined = getFacetsDefined();

    // we check pattern first
    if ( (thisFacetsDefined & DatatypeValidator::FACET_PATTERN ) != 0 )
    {
        if (getRegex()->matches(content, manager) ==false)
        {
            ThrowXMLwithMemMgr2(InvalidDatatypeValueException
                    , XMLExcepts::VALUE_NotMatch_Pattern
                    , content
                    , getPattern()
                    , manager);
        }
    }

    // if this is a base validator, we only need to check pattern facet
    // all other facet were inherited by the derived type
    if (asBase)
        return;

    XMLBigDecimal  compareDataValue(content, manager);
    XMLBigDecimal* compareData = &compareDataValue;

    if (getEnumeration())
    {
        XMLSize_t i=0;
        XMLSize_t enumLength = getEnumeration()->size();
        for ( ; i < enumLength; i++)
        {
            if (compareValues(compareData, (XMLBigDecimal*) getEnumeration()->elementAt(i)) ==0 )
                break;
        }

        if (i == enumLength)
            ThrowXMLwithMemMgr1(InvalidDatatypeValueException, XMLExcepts::VALUE_NotIn_Enumeration, content, manager);
    }

    boundsCheck(compareData, manager);

    if ( (thisFacetsDefined & DatatypeValidator::FACET_FRACTIONDIGITS) != 0 )
    {
        if ( compareData->getScale() > fFractionDigits )
        {
            XMLCh value1[BUF_LEN+1];
            XMLCh value2[BUF_LEN+1];
            XMLString::binToText(compareData->getScale(), value1, BUF_LEN, 10, manager);
            XMLString::binToText(fFractionDigits, value2, BUF_LEN, 10, manager);
            ThrowXMLwithMemMgr3(InvalidDatatypeFacetException
                              , XMLExcepts::VALUE_exceed_fractDigit
                              , compareData->getRawData()
                              , value1
                              , value2
                              , manager);
        }
    }

    if ( (thisFacetsDefined & DatatypeValidator::FACET_TOTALDIGITS) != 0 )
    {
        if ( compareData->getTotalDigit() > fTotalDigits )
        {
            XMLCh value1[BUF_LEN+1];
            XMLCh value2[BUF_LEN+1];
            XMLString::binToText(compareData->getTotalDigit(), value1, BUF_LEN, 10, manager);
            XMLString::binToText(fTotalDigits, value2, BUF_LEN, 10, manager);
            ThrowXMLwithMemMgr3(InvalidDatatypeFacetException
                              , XMLExcepts::VALUE_exceed_totalDigit
                              , compareData->getRawData()
                              , value1
                              , value2
                              , manager);
        }

        /***
         E2-44 totalDigits
         ... by restricting it to numbers that are expressible as i x 10^-n
         where i and n are integers such that |i| < 10^totalDigits and 0 <= n <= totalDigits.
         ***/

        if ( compareData->getScale() > fTotalDigits )
        {
            XMLCh value1[BUF_LEN+1];
            XMLCh value2[BUF_LEN+1];
            XMLString::binToText(compareData->getScale(), value1, BUF_LEN, 10, manager);
            XMLString::binToText(fTotalDigits, value2, BUF_LEN, 10, manager);
            ThrowXMLwithMemMgr3(InvalidDatatypeFacetException
                              , XMLExcepts::VALUE_exceed_totalDigit
                              , compareData->getRawData()
                              , value1
                              , value2
                              , manager);
        }
    }
}